

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cfg.cpp
# Opt level: O0

void __thiscall spirv_cross::CFG::add_branch(CFG *this,uint32_t from,uint32_t to)

{
  mapped_type *pmVar1;
  anon_class_1_0_00000001 local_19;
  uint32_t local_18;
  uint32_t uStack_14;
  anon_class_1_0_00000001 add_unique;
  uint32_t to_local;
  uint32_t from_local;
  CFG *this_local;
  
  local_18 = to;
  uStack_14 = from;
  pmVar1 = ::std::
           unordered_map<unsigned_int,_spirv_cross::SmallVector<unsigned_int,_8UL>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::SmallVector<unsigned_int,_8UL>_>_>_>
           ::operator[](&this->preceding_edges,&local_18);
  add_branch::anon_class_1_0_00000001::operator()(&local_19,pmVar1,uStack_14);
  pmVar1 = ::std::
           unordered_map<unsigned_int,_spirv_cross::SmallVector<unsigned_int,_8UL>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::SmallVector<unsigned_int,_8UL>_>_>_>
           ::operator[](&this->succeeding_edges,&stack0xffffffffffffffec);
  add_branch::anon_class_1_0_00000001::operator()(&local_19,pmVar1,local_18);
  return;
}

Assistant:

void CFG::add_branch(uint32_t from, uint32_t to)
{
	const auto add_unique = [](SmallVector<uint32_t> &l, uint32_t value) {
		auto itr = find(begin(l), end(l), value);
		if (itr == end(l))
			l.push_back(value);
	};
	add_unique(preceding_edges[to], from);
	add_unique(succeeding_edges[from], to);
}